

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dtable.c
# Opt level: O0

BOOL installMethodInDtable
               (Class class,SparseArray *dtable,objc_method *method,objc_method *method_to_replace,
               BOOL replaceExisting)

{
  BOOL BVar1;
  uint32_t uVar2;
  int iVar3;
  objc_method *method_to_replace_00;
  dtable_t dtable_00;
  objc_class *local_50;
  objc_class *subclass;
  uint32_t untyped_idx;
  objc_method *oldMethod;
  uint32_t sel_id;
  BOOL replaceExisting_local;
  objc_method *method_to_replace_local;
  objc_method *method_local;
  SparseArray *dtable_local;
  Class class_local;
  
  uVar2 = (uint32_t)(method->selector->field_0).index;
  method_to_replace_00 = (objc_method *)SparseArrayLookup(dtable,uVar2);
  if ((replaceExisting == '\0') || (method_to_replace == method_to_replace_00)) {
    if ((replaceExisting == '\0') && (method_to_replace_00 != (objc_method *)0x0)) {
      class_local._7_1_ = '\0';
    }
    else if ((method_to_replace_00 == (objc_method *)0x0) ||
            (method_to_replace_00->imp != method->imp)) {
      SparseArrayInsert(dtable,uVar2,method);
      uVar2 = get_untyped_idx(method->selector);
      SparseArrayInsert(dtable,uVar2,method);
      if (installMethodInDtable::cxx_construct == (SEL)0x0) {
        installMethodInDtable::cxx_construct = sel_registerName(".cxx_construct");
        installMethodInDtable::cxx_destruct = sel_registerName(".cxx_destruct");
      }
      BVar1 = selEqualUnTyped(method->selector,installMethodInDtable::cxx_construct);
      if (BVar1 == '\0') {
        BVar1 = selEqualUnTyped(method->selector,installMethodInDtable::cxx_destruct);
        if (BVar1 != '\0') {
          class->cxx_destruct = method->imp;
        }
      }
      else {
        class->cxx_construct = method->imp;
      }
      for (local_50 = class->subclass_list; local_50 != (objc_class *)0x0;
          local_50 = local_50->sibling_class) {
        iVar3 = classHasDtable(local_50);
        if (iVar3 != 0) {
          dtable_00 = dtable_for_class(local_50);
          installMethodInDtable(local_50,dtable_00,method,method_to_replace_00,'\x01');
        }
      }
      if (method_to_replace_00 != (objc_method *)0x0) {
        LOCK();
        objc_method_cache_version = objc_method_cache_version + 1;
        UNLOCK();
      }
      class_local._7_1_ = '\x01';
    }
    else {
      class_local._7_1_ = '\0';
    }
  }
  else {
    class_local._7_1_ = '\0';
  }
  return class_local._7_1_;
}

Assistant:

static BOOL installMethodInDtable(Class class,
                                  SparseArray *dtable,
                                  struct objc_method *method,
                                  struct objc_method *method_to_replace,
                                  BOOL replaceExisting)
{
	ASSERT(uninstalled_dtable != dtable);
	uint32_t sel_id = method->selector->index;
	struct objc_method *oldMethod = SparseArrayLookup(dtable, sel_id);
	// If we're being asked to replace an existing method, don't if it's the
	// wrong one.
	if ((replaceExisting) && (method_to_replace != oldMethod))
	{
		return NO;
	}
	// If we're not being asked to replace existing methods and there is an
	// existing one, don't replace it.
	if (!replaceExisting && (oldMethod != NULL))
	{
		return NO;
	}
	// If this method is the one already installed, pretend to install it again.
	if (NULL != oldMethod && (oldMethod->imp == method->imp))
	{
		return NO;
	}
	SparseArrayInsert(dtable, sel_id, method);
	// In TDD mode, we also register the first typed method that we
	// encounter as the untyped version.
#ifdef TYPE_DEPENDENT_DISPATCH
	uint32_t untyped_idx = get_untyped_idx(method->selector);
	SparseArrayInsert(dtable, untyped_idx, method);
#endif

	static SEL cxx_construct, cxx_destruct;
	if (NULL == cxx_construct)
	{
		cxx_construct = sel_registerName(".cxx_construct");
		cxx_destruct = sel_registerName(".cxx_destruct");
	}
	if (selEqualUnTyped(method->selector, cxx_construct))
	{
		class->cxx_construct = method->imp;
	}
	else if (selEqualUnTyped(method->selector, cxx_destruct))
	{
		class->cxx_destruct = method->imp;
	}

	for (struct objc_class *subclass=class->subclass_list ; 
		Nil != subclass ; subclass = subclass->sibling_class)
	{
		// Don't bother updating dtables for subclasses that haven't been
		// initialized yet
		if (!classHasDtable(subclass)) { continue; }

		// Recursively install this method in all subclasses
		installMethodInDtable(subclass,
		                      dtable_for_class(subclass),
		                      method,
		                      oldMethod,
		                      YES);
	}

	// Invalidate the old slot, if there is one.
	if (NULL != oldMethod)
	{
#ifndef NO_SAFE_CACHING
		objc_method_cache_version++;
#endif
	}
	return YES;
}